

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

ShaderResources * __thiscall
spirv_cross::Compiler::get_shader_resources
          (ShaderResources *__return_storage_ptr__,Compiler *this,
          unordered_set<spirv_cross::TypedID<(spirv_cross::Types)2>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>_>
          *active_variables)

{
  ParsedIR *this_00;
  size_t sVar1;
  Variant *pVVar2;
  undefined8 uVar3;
  pointer pcVar4;
  bool fallback_prefer_instance_name;
  bool bVar5;
  uint32_t uVar6;
  StorageClass SVar7;
  SPIRVariable *var;
  SPIRType *pSVar8;
  __node_base_ptr p_Var9;
  __node_base_ptr p_Var10;
  string *psVar11;
  ShaderResources *this_01;
  TypedID<(spirv_cross::Types)0> *pTVar12;
  ulong uVar13;
  SmallVector<spirv_cross::BuiltInResource,_8UL> *this_02;
  undefined1 local_130 [16];
  undefined1 auStack_120 [8];
  _Alloc_hider local_118;
  undefined1 local_110 [28];
  undefined4 local_f4;
  ShaderResources *local_f0;
  FunctionID *local_e8;
  _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)4>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)4>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)4>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_e0;
  ShaderResources *local_d8;
  ShaderResources *local_d0;
  LoopLock local_c8;
  undefined8 local_c0;
  uint32_t local_b8;
  string local_b0;
  _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,_spirv_cross::TypedID<(spirv_cross::Types)2>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_90;
  ShaderResources *local_88;
  ShaderResources *local_80;
  ShaderResources *local_78;
  ShaderResources *local_70;
  ShaderResources *local_68;
  ShaderResources *local_60;
  ShaderResources *local_58;
  ShaderResources *local_50;
  ShaderResources *local_48;
  ShaderResources *local_40;
  TypedID<(spirv_cross::Types)0> *local_38;
  
  (__return_storage_ptr__->uniform_buffers).super_VectorView<spirv_cross::Resource>.buffer_size = 0;
  (__return_storage_ptr__->uniform_buffers).super_VectorView<spirv_cross::Resource>.ptr =
       (Resource *)&(__return_storage_ptr__->uniform_buffers).stack_storage;
  (__return_storage_ptr__->uniform_buffers).buffer_capacity = 8;
  (__return_storage_ptr__->storage_buffers).super_VectorView<spirv_cross::Resource>.buffer_size = 0;
  (__return_storage_ptr__->storage_buffers).super_VectorView<spirv_cross::Resource>.ptr =
       (Resource *)&(__return_storage_ptr__->storage_buffers).stack_storage;
  (__return_storage_ptr__->storage_buffers).buffer_capacity = 8;
  (__return_storage_ptr__->stage_inputs).super_VectorView<spirv_cross::Resource>.buffer_size = 0;
  (__return_storage_ptr__->stage_inputs).super_VectorView<spirv_cross::Resource>.ptr =
       (Resource *)&(__return_storage_ptr__->stage_inputs).stack_storage;
  (__return_storage_ptr__->stage_inputs).buffer_capacity = 8;
  (__return_storage_ptr__->stage_outputs).super_VectorView<spirv_cross::Resource>.buffer_size = 0;
  (__return_storage_ptr__->stage_outputs).super_VectorView<spirv_cross::Resource>.ptr =
       (Resource *)&(__return_storage_ptr__->stage_outputs).stack_storage;
  (__return_storage_ptr__->stage_outputs).buffer_capacity = 8;
  (__return_storage_ptr__->subpass_inputs).super_VectorView<spirv_cross::Resource>.buffer_size = 0;
  (__return_storage_ptr__->subpass_inputs).super_VectorView<spirv_cross::Resource>.ptr =
       (Resource *)&(__return_storage_ptr__->subpass_inputs).stack_storage;
  (__return_storage_ptr__->subpass_inputs).buffer_capacity = 8;
  (__return_storage_ptr__->storage_images).super_VectorView<spirv_cross::Resource>.buffer_size = 0;
  (__return_storage_ptr__->storage_images).super_VectorView<spirv_cross::Resource>.ptr =
       (Resource *)&(__return_storage_ptr__->storage_images).stack_storage;
  (__return_storage_ptr__->storage_images).buffer_capacity = 8;
  (__return_storage_ptr__->sampled_images).super_VectorView<spirv_cross::Resource>.buffer_size = 0;
  (__return_storage_ptr__->sampled_images).super_VectorView<spirv_cross::Resource>.ptr =
       (Resource *)&(__return_storage_ptr__->sampled_images).stack_storage;
  (__return_storage_ptr__->sampled_images).buffer_capacity = 8;
  (__return_storage_ptr__->atomic_counters).super_VectorView<spirv_cross::Resource>.buffer_size = 0;
  (__return_storage_ptr__->atomic_counters).super_VectorView<spirv_cross::Resource>.ptr =
       (Resource *)&(__return_storage_ptr__->atomic_counters).stack_storage;
  (__return_storage_ptr__->atomic_counters).buffer_capacity = 8;
  (__return_storage_ptr__->acceleration_structures).super_VectorView<spirv_cross::Resource>.
  buffer_size = 0;
  (__return_storage_ptr__->acceleration_structures).super_VectorView<spirv_cross::Resource>.ptr =
       (Resource *)&(__return_storage_ptr__->acceleration_structures).stack_storage;
  (__return_storage_ptr__->acceleration_structures).buffer_capacity = 8;
  (__return_storage_ptr__->gl_plain_uniforms).super_VectorView<spirv_cross::Resource>.buffer_size =
       0;
  (__return_storage_ptr__->gl_plain_uniforms).super_VectorView<spirv_cross::Resource>.ptr =
       (Resource *)&(__return_storage_ptr__->gl_plain_uniforms).stack_storage;
  (__return_storage_ptr__->gl_plain_uniforms).buffer_capacity = 8;
  (__return_storage_ptr__->push_constant_buffers).super_VectorView<spirv_cross::Resource>.
  buffer_size = 0;
  (__return_storage_ptr__->push_constant_buffers).super_VectorView<spirv_cross::Resource>.ptr =
       (Resource *)&(__return_storage_ptr__->push_constant_buffers).stack_storage;
  (__return_storage_ptr__->push_constant_buffers).buffer_capacity = 8;
  (__return_storage_ptr__->shader_record_buffers).super_VectorView<spirv_cross::Resource>.
  buffer_size = 0;
  (__return_storage_ptr__->shader_record_buffers).super_VectorView<spirv_cross::Resource>.ptr =
       (Resource *)&(__return_storage_ptr__->shader_record_buffers).stack_storage;
  (__return_storage_ptr__->shader_record_buffers).buffer_capacity = 8;
  (__return_storage_ptr__->separate_images).super_VectorView<spirv_cross::Resource>.buffer_size = 0;
  (__return_storage_ptr__->separate_images).super_VectorView<spirv_cross::Resource>.ptr =
       (Resource *)&(__return_storage_ptr__->separate_images).stack_storage;
  (__return_storage_ptr__->separate_images).buffer_capacity = 8;
  (__return_storage_ptr__->separate_samplers).super_VectorView<spirv_cross::Resource>.buffer_size =
       0;
  (__return_storage_ptr__->separate_samplers).super_VectorView<spirv_cross::Resource>.ptr =
       (Resource *)&(__return_storage_ptr__->separate_samplers).stack_storage;
  (__return_storage_ptr__->separate_samplers).buffer_capacity = 8;
  (__return_storage_ptr__->builtin_inputs).super_VectorView<spirv_cross::BuiltInResource>.
  buffer_size = 0;
  (__return_storage_ptr__->builtin_inputs).super_VectorView<spirv_cross::BuiltInResource>.ptr =
       (BuiltInResource *)&(__return_storage_ptr__->builtin_inputs).stack_storage;
  (__return_storage_ptr__->builtin_inputs).buffer_capacity = 8;
  (__return_storage_ptr__->builtin_outputs).super_VectorView<spirv_cross::BuiltInResource>.
  buffer_size = 0;
  (__return_storage_ptr__->builtin_outputs).super_VectorView<spirv_cross::BuiltInResource>.ptr =
       (BuiltInResource *)&(__return_storage_ptr__->builtin_outputs).stack_storage;
  (__return_storage_ptr__->builtin_outputs).buffer_capacity = 8;
  fallback_prefer_instance_name = reflection_ssbo_instance_name_is_significant(this);
  this_00 = &this->ir;
  ParsedIR::create_loop_hard_lock(this_00);
  sVar1 = (this->ir).ids_for_type[2].super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.
          buffer_size;
  if (sVar1 != 0) {
    local_f0 = (ShaderResources *)&__return_storage_ptr__->storage_buffers;
    local_d0 = (ShaderResources *)&__return_storage_ptr__->stage_inputs;
    local_d8 = (ShaderResources *)&__return_storage_ptr__->stage_outputs;
    local_40 = (ShaderResources *)&__return_storage_ptr__->subpass_inputs;
    local_80 = (ShaderResources *)&__return_storage_ptr__->storage_images;
    local_60 = (ShaderResources *)&__return_storage_ptr__->sampled_images;
    local_48 = (ShaderResources *)&__return_storage_ptr__->atomic_counters;
    local_68 = (ShaderResources *)&__return_storage_ptr__->acceleration_structures;
    local_70 = (ShaderResources *)&__return_storage_ptr__->gl_plain_uniforms;
    local_50 = (ShaderResources *)&__return_storage_ptr__->push_constant_buffers;
    local_58 = (ShaderResources *)&__return_storage_ptr__->shader_record_buffers;
    local_88 = (ShaderResources *)&__return_storage_ptr__->separate_images;
    local_78 = (ShaderResources *)&__return_storage_ptr__->separate_samplers;
    pTVar12 = (this->ir).ids_for_type[2].
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    local_38 = pTVar12 + sVar1;
    local_e0 = &(this->ir).entry_points._M_h;
    local_e8 = &(this->ir).default_entry_point;
    do {
      pVVar2 = (this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar2[pTVar12->id].type == TypeVariable) {
        var = Variant::get<spirv_cross::SPIRVariable>(pVVar2 + pTVar12->id);
        pSVar8 = Variant::get<spirv_cross::SPIRType>
                           ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                            *(uint *)&(var->super_IVariant).field_0xc);
        if ((var->storage != Function) && (pSVar8->pointer == true)) {
          if (&active_variables->_M_h !=
              (_Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,_spirv_cross::TypedID<(spirv_cross::Types)2>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               *)0x0) {
            local_130._0_4_ = (var->super_IVariant).self.id;
            p_Var9 = ::std::
                     _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,_spirv_cross::TypedID<(spirv_cross::Types)2>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     ::_M_find_before_node
                               (&active_variables->_M_h,
                                (ulong)(uint)local_130._0_4_ %
                                (active_variables->_M_h)._M_bucket_count,(key_type *)local_130,
                                (ulong)(uint)local_130._0_4_);
            if ((p_Var9 == (__node_base_ptr)0x0) || (p_Var9->_M_nxt == (_Hash_node_base *)0x0))
            goto LAB_0032dc71;
          }
          uVar6 = ParsedIR::get_spirv_version(this_00);
          if (uVar6 < 0x10400) {
            if ((var->storage | StorageClassUniform) == Output) {
              bVar5 = interface_variable_exists_in_entry_point(this,(var->super_IVariant).self.id);
              goto LAB_0032d62c;
            }
          }
          else {
            bVar5 = interface_variable_exists_in_entry_point(this,(var->super_IVariant).self.id);
LAB_0032d62c:
            if (bVar5 == false) goto LAB_0032dc71;
          }
          bVar5 = is_builtin_variable(this,var);
          SVar7 = var->storage;
          uVar13 = (ulong)SVar7;
          if (bVar5) {
            if ((SVar7 | StorageClassUniform) == Output) {
              this_02 = &__return_storage_ptr__->builtin_outputs;
              if (SVar7 == Input) {
                this_02 = &__return_storage_ptr__->builtin_inputs;
              }
              local_130._4_4_ = 0;
              local_130._8_4_ = 0;
              local_130._12_4_ = 0;
              auStack_120._0_4_ = 0;
              local_118._M_p = local_110 + 8;
              local_110._0_8_ = 0;
              local_110[8] = '\0';
              local_90 = &active_variables->_M_h;
              bVar5 = ParsedIR::has_decoration(this_00,(ID)(pSVar8->super_IVariant).self.id,Block);
              if (bVar5) {
                local_c0 = *(undefined8 *)&(var->super_IVariant).self;
                local_b8 = (pSVar8->super_IVariant).self.id;
                get_remapped_declared_block_name_abi_cxx11_(&local_b0,this,(uint32_t)local_c0,false)
                ;
                auStack_120._0_4_ = local_b8;
                local_130._8_4_ = (undefined4)local_c0;
                local_130._12_4_ = (undefined4)((ulong)local_c0 >> 0x20);
                ::std::__cxx11::string::operator=((string *)&local_118,(string *)&local_b0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                  operator_delete(local_b0._M_dataplus._M_p);
                }
                if ((int)(pSVar8->member_types).
                         super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size
                    != 0) {
                  uVar13 = 0;
                  do {
                    local_130._4_4_ =
                         (pSVar8->member_types).
                         super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[uVar13].
                         id;
                    local_130._0_4_ =
                         ParsedIR::get_member_decoration
                                   (this_00,(TypeID)(pSVar8->super_IVariant).self.id,
                                    (uint32_t)uVar13,BuiltIn);
                    SmallVector<spirv_cross::BuiltInResource,_8UL>::push_back
                              (this_02,(BuiltInResource *)local_130);
                    uVar13 = uVar13 + 1;
                  } while (uVar13 < (uint)(pSVar8->member_types).
                                          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
                                          .buffer_size);
                }
              }
              else {
                bVar5 = ParsedIR::has_decoration
                                  (this_00,(ID)(var->super_IVariant).self.id,DecorationPatch);
                local_f4 = (undefined4)CONCAT71((int7)(uVar13 >> 8),1);
                if (!bVar5) {
                  uVar13 = (ulong)(this->ir).default_entry_point.id;
                  p_Var10 = ::std::
                            _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)4>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)4>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)4>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                            ::_M_find_before_node
                                      (local_e0,uVar13 % (this->ir).entry_points._M_h.
                                                         _M_bucket_count,local_e8,uVar13);
                  if (*(int *)&p_Var10->_M_nxt[0x1f]._M_nxt == 1) {
                    local_f4 = 0;
                  }
                  else {
                    uVar13 = (ulong)(this->ir).default_entry_point.id;
                    p_Var10 = ::std::
                              _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)4>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)4>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)4>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                              ::_M_find_before_node
                                        (local_e0,uVar13 % (this->ir).entry_points._M_h.
                                                           _M_bucket_count,local_e8,uVar13);
                    if (*(int *)&p_Var10->_M_nxt[0x1f]._M_nxt == 2) {
                      local_f4 = (undefined4)
                                 CONCAT71((int7)((ulong)p_Var10->_M_nxt >> 8),var->storage != Input)
                      ;
                    }
                  }
                }
                local_c0 = *(undefined8 *)&(var->super_IVariant).self;
                local_b8 = (pSVar8->super_IVariant).self.id;
                psVar11 = ParsedIR::get_name_abi_cxx11_(this_00,(ID)(uint32_t)local_c0);
                local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
                pcVar4 = (psVar11->_M_dataplus)._M_p;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_b0,pcVar4,pcVar4 + psVar11->_M_string_length);
                auStack_120._0_4_ = local_b8;
                local_130._8_4_ = (undefined4)local_c0;
                local_130._12_4_ = (undefined4)((ulong)local_c0 >> 0x20);
                ::std::__cxx11::string::operator=((string *)&local_118,(string *)&local_b0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                  operator_delete(local_b0._M_dataplus._M_p);
                }
                if ((char)local_f4 == '\0' &&
                    (pSVar8->array).super_VectorView<unsigned_int>.buffer_size != 0) {
                  pSVar8 = get_variable_data_type(this,var);
                  uVar6 = (pSVar8->parent_type).id;
                }
                else {
                  uVar6 = *(uint32_t *)&(var->super_IVariant).field_0xc;
                  if ((var->phi_variable == false) && (var->storage != AtomicCounter)) {
                    uVar6 = get_pointee_type_id(this,uVar6);
                  }
                }
                local_130._4_4_ = uVar6;
                if (uVar6 == 0) {
                  __assert_fail("resource.value_type_id",
                                "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_cross.cpp"
                                ,0x41e,
                                "auto spirv_cross::Compiler::get_shader_resources(const unordered_set<VariableID> *)::(anonymous class)::operator()(uint32_t, const SPIRVariable &) const"
                               );
                }
                local_130._0_4_ =
                     ParsedIR::get_decoration(this_00,(ID)(var->super_IVariant).self.id,BuiltIn);
                SmallVector<spirv_cross::BuiltInResource,_8UL>::push_back
                          (this_02,(BuiltInResource *)local_130);
              }
              if (local_118._M_p != local_110 + 8) {
                operator_delete(local_118._M_p);
              }
              active_variables =
                   (unordered_set<spirv_cross::TypedID<(spirv_cross::Types)2>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>_>
                    *)local_90;
            }
          }
          else {
            if (SVar7 == StorageClassUniformConstant) {
              if ((pSVar8->image).dim == DimSubpassData) {
                uVar3 = *(undefined8 *)&(var->super_IVariant).self;
                local_130._0_4_ = (undefined4)uVar3;
                local_130._4_4_ = (undefined4)((ulong)uVar3 >> 0x20);
                local_130._8_4_ = (pSVar8->super_IVariant).self.id;
                psVar11 = ParsedIR::get_name_abi_cxx11_(this_00,(ID)local_130._0_4_);
                auStack_120 = (undefined1  [8])local_110;
                pcVar4 = (psVar11->_M_dataplus)._M_p;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)auStack_120,pcVar4,pcVar4 + psVar11->_M_string_length);
                this_01 = local_40;
              }
              else {
LAB_0032d8bf:
                SVar7 = pSVar8->storage;
                if (SVar7 == StorageClassUniform) {
                  bVar5 = ParsedIR::has_decoration
                                    (this_00,(ID)(pSVar8->super_IVariant).self.id,Block);
                  if (bVar5) {
                    uVar3 = *(undefined8 *)&(var->super_IVariant).self;
                    local_130._0_4_ = (undefined4)uVar3;
                    local_130._4_4_ = (undefined4)((ulong)uVar3 >> 0x20);
                    local_130._8_4_ = (pSVar8->super_IVariant).self.id;
                    get_remapped_declared_block_name_abi_cxx11_
                              ((string *)auStack_120,this,local_130._0_4_,false);
                    this_01 = __return_storage_ptr__;
                    goto LAB_0032dc53;
                  }
                  SVar7 = pSVar8->storage;
                  if (SVar7 == StorageClassUniform) {
                    bVar5 = ParsedIR::has_decoration
                                      (this_00,(ID)(pSVar8->super_IVariant).self.id,BufferBlock);
                    if (bVar5) {
                      uVar3 = *(undefined8 *)&(var->super_IVariant).self;
                      local_130._0_4_ = (undefined4)uVar3;
                      local_130._4_4_ = (undefined4)((ulong)uVar3 >> 0x20);
                      local_130._8_4_ = (pSVar8->super_IVariant).self.id;
                      get_remapped_declared_block_name_abi_cxx11_
                                ((string *)auStack_120,this,local_130._0_4_,
                                 fallback_prefer_instance_name);
                      this_01 = local_f0;
                      goto LAB_0032dc53;
                    }
                    SVar7 = pSVar8->storage;
                  }
                }
                if ((int)SVar7 < 10) {
                  if (SVar7 == StorageClassUniformConstant) {
                    switch(pSVar8->basetype) {
                    case Image:
                      uVar6 = (pSVar8->image).sampled;
                      if (uVar6 == 1) {
                        uVar3 = *(undefined8 *)&(var->super_IVariant).self;
                        local_130._0_4_ = (undefined4)uVar3;
                        local_130._4_4_ = (undefined4)((ulong)uVar3 >> 0x20);
                        local_130._8_4_ = (pSVar8->super_IVariant).self.id;
                        psVar11 = ParsedIR::get_name_abi_cxx11_(this_00,(ID)local_130._0_4_);
                        auStack_120 = (undefined1  [8])local_110;
                        pcVar4 = (psVar11->_M_dataplus)._M_p;
                        ::std::__cxx11::string::_M_construct<char*>
                                  ((string *)auStack_120,pcVar4,pcVar4 + psVar11->_M_string_length);
                        this_01 = local_88;
                      }
                      else {
                        if (uVar6 != 2) goto LAB_0032dc71;
                        uVar3 = *(undefined8 *)&(var->super_IVariant).self;
                        local_130._0_4_ = (undefined4)uVar3;
                        local_130._4_4_ = (undefined4)((ulong)uVar3 >> 0x20);
                        local_130._8_4_ = (pSVar8->super_IVariant).self.id;
                        psVar11 = ParsedIR::get_name_abi_cxx11_(this_00,(ID)local_130._0_4_);
                        auStack_120 = (undefined1  [8])local_110;
                        pcVar4 = (psVar11->_M_dataplus)._M_p;
                        ::std::__cxx11::string::_M_construct<char*>
                                  ((string *)auStack_120,pcVar4,pcVar4 + psVar11->_M_string_length);
                        this_01 = local_80;
                      }
                      break;
                    case SampledImage:
                      uVar3 = *(undefined8 *)&(var->super_IVariant).self;
                      local_130._0_4_ = (undefined4)uVar3;
                      local_130._4_4_ = (undefined4)((ulong)uVar3 >> 0x20);
                      local_130._8_4_ = (pSVar8->super_IVariant).self.id;
                      psVar11 = ParsedIR::get_name_abi_cxx11_(this_00,(ID)local_130._0_4_);
                      auStack_120 = (undefined1  [8])local_110;
                      pcVar4 = (psVar11->_M_dataplus)._M_p;
                      ::std::__cxx11::string::_M_construct<char*>
                                ((string *)auStack_120,pcVar4,pcVar4 + psVar11->_M_string_length);
                      this_01 = local_60;
                      break;
                    case Sampler:
                      uVar3 = *(undefined8 *)&(var->super_IVariant).self;
                      local_130._0_4_ = (undefined4)uVar3;
                      local_130._4_4_ = (undefined4)((ulong)uVar3 >> 0x20);
                      local_130._8_4_ = (pSVar8->super_IVariant).self.id;
                      psVar11 = ParsedIR::get_name_abi_cxx11_(this_00,(ID)local_130._0_4_);
                      auStack_120 = (undefined1  [8])local_110;
                      pcVar4 = (psVar11->_M_dataplus)._M_p;
                      ::std::__cxx11::string::_M_construct<char*>
                                ((string *)auStack_120,pcVar4,pcVar4 + psVar11->_M_string_length);
                      this_01 = local_78;
                      break;
                    case AccelerationStructure:
                      uVar3 = *(undefined8 *)&(var->super_IVariant).self;
                      local_130._0_4_ = (undefined4)uVar3;
                      local_130._4_4_ = (undefined4)((ulong)uVar3 >> 0x20);
                      local_130._8_4_ = (pSVar8->super_IVariant).self.id;
                      psVar11 = ParsedIR::get_name_abi_cxx11_(this_00,(ID)local_130._0_4_);
                      auStack_120 = (undefined1  [8])local_110;
                      pcVar4 = (psVar11->_M_dataplus)._M_p;
                      ::std::__cxx11::string::_M_construct<char*>
                                ((string *)auStack_120,pcVar4,pcVar4 + psVar11->_M_string_length);
                      this_01 = local_68;
                      break;
                    default:
                      uVar3 = *(undefined8 *)&(var->super_IVariant).self;
                      local_130._0_4_ = (undefined4)uVar3;
                      local_130._4_4_ = (undefined4)((ulong)uVar3 >> 0x20);
                      local_130._8_4_ = (pSVar8->super_IVariant).self.id;
                      psVar11 = ParsedIR::get_name_abi_cxx11_(this_00,(ID)local_130._0_4_);
                      auStack_120 = (undefined1  [8])local_110;
                      pcVar4 = (psVar11->_M_dataplus)._M_p;
                      ::std::__cxx11::string::_M_construct<char*>
                                ((string *)auStack_120,pcVar4,pcVar4 + psVar11->_M_string_length);
                      this_01 = local_70;
                    }
                  }
                  else {
                    if (SVar7 != PushConstant) goto LAB_0032dc71;
                    uVar3 = *(undefined8 *)&(var->super_IVariant).self;
                    local_130._0_4_ = (undefined4)uVar3;
                    local_130._4_4_ = (undefined4)((ulong)uVar3 >> 0x20);
                    local_130._8_4_ = (pSVar8->super_IVariant).self.id;
                    psVar11 = ParsedIR::get_name_abi_cxx11_(this_00,(ID)local_130._0_4_);
                    auStack_120 = (undefined1  [8])local_110;
                    pcVar4 = (psVar11->_M_dataplus)._M_p;
                    ::std::__cxx11::string::_M_construct<char*>
                              ((string *)auStack_120,pcVar4,pcVar4 + psVar11->_M_string_length);
                    this_01 = local_50;
                  }
                }
                else if (SVar7 == AtomicCounter) {
                  uVar3 = *(undefined8 *)&(var->super_IVariant).self;
                  local_130._0_4_ = (undefined4)uVar3;
                  local_130._4_4_ = (undefined4)((ulong)uVar3 >> 0x20);
                  local_130._8_4_ = (pSVar8->super_IVariant).self.id;
                  psVar11 = ParsedIR::get_name_abi_cxx11_(this_00,(ID)local_130._0_4_);
                  auStack_120 = (undefined1  [8])local_110;
                  pcVar4 = (psVar11->_M_dataplus)._M_p;
                  ::std::__cxx11::string::_M_construct<char*>
                            ((string *)auStack_120,pcVar4,pcVar4 + psVar11->_M_string_length);
                  this_01 = local_48;
                }
                else if (SVar7 == ShaderRecordBufferKHR) {
                  uVar3 = *(undefined8 *)&(var->super_IVariant).self;
                  local_130._0_4_ = (undefined4)uVar3;
                  local_130._4_4_ = (undefined4)((ulong)uVar3 >> 0x20);
                  local_130._8_4_ = (pSVar8->super_IVariant).self.id;
                  get_remapped_declared_block_name_abi_cxx11_
                            ((string *)auStack_120,this,local_130._0_4_,
                             fallback_prefer_instance_name);
                  this_01 = local_58;
                }
                else {
                  if (SVar7 != StorageBuffer) goto LAB_0032dc71;
                  uVar3 = *(undefined8 *)&(var->super_IVariant).self;
                  local_130._0_4_ = (undefined4)uVar3;
                  local_130._4_4_ = (undefined4)((ulong)uVar3 >> 0x20);
                  local_130._8_4_ = (pSVar8->super_IVariant).self.id;
                  get_remapped_declared_block_name_abi_cxx11_
                            ((string *)auStack_120,this,local_130._0_4_,
                             fallback_prefer_instance_name);
                  this_01 = local_f0;
                }
              }
            }
            else if (SVar7 == Output) {
              bVar5 = ParsedIR::has_decoration(this_00,(ID)(pSVar8->super_IVariant).self.id,Block);
              if (bVar5) {
                uVar3 = *(undefined8 *)&(var->super_IVariant).self;
                local_130._0_4_ = (undefined4)uVar3;
                local_130._4_4_ = (undefined4)((ulong)uVar3 >> 0x20);
                local_130._8_4_ = (pSVar8->super_IVariant).self.id;
                get_remapped_declared_block_name_abi_cxx11_
                          ((string *)auStack_120,this,local_130._0_4_,false);
                this_01 = local_d8;
              }
              else {
                uVar3 = *(undefined8 *)&(var->super_IVariant).self;
                local_130._0_4_ = (undefined4)uVar3;
                local_130._4_4_ = (undefined4)((ulong)uVar3 >> 0x20);
                local_130._8_4_ = (pSVar8->super_IVariant).self.id;
                psVar11 = ParsedIR::get_name_abi_cxx11_(this_00,(ID)local_130._0_4_);
                auStack_120 = (undefined1  [8])local_110;
                pcVar4 = (psVar11->_M_dataplus)._M_p;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)auStack_120,pcVar4,pcVar4 + psVar11->_M_string_length);
                this_01 = local_d8;
              }
            }
            else {
              if (SVar7 != Input) goto LAB_0032d8bf;
              bVar5 = ParsedIR::has_decoration(this_00,(ID)(pSVar8->super_IVariant).self.id,Block);
              if (bVar5) {
                uVar3 = *(undefined8 *)&(var->super_IVariant).self;
                local_130._0_4_ = (undefined4)uVar3;
                local_130._4_4_ = (undefined4)((ulong)uVar3 >> 0x20);
                local_130._8_4_ = (pSVar8->super_IVariant).self.id;
                get_remapped_declared_block_name_abi_cxx11_
                          ((string *)auStack_120,this,local_130._0_4_,false);
                this_01 = local_d0;
              }
              else {
                uVar3 = *(undefined8 *)&(var->super_IVariant).self;
                local_130._0_4_ = (undefined4)uVar3;
                local_130._4_4_ = (undefined4)((ulong)uVar3 >> 0x20);
                local_130._8_4_ = (pSVar8->super_IVariant).self.id;
                psVar11 = ParsedIR::get_name_abi_cxx11_(this_00,(ID)local_130._0_4_);
                auStack_120 = (undefined1  [8])local_110;
                pcVar4 = (psVar11->_M_dataplus)._M_p;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)auStack_120,pcVar4,pcVar4 + psVar11->_M_string_length);
                this_01 = local_d0;
              }
            }
LAB_0032dc53:
            SmallVector<spirv_cross::Resource,_8UL>::push_back
                      (&this_01->uniform_buffers,(Resource *)local_130);
            if (auStack_120 != (undefined1  [8])local_110) {
              operator_delete((void *)auStack_120);
            }
          }
        }
      }
LAB_0032dc71:
      pTVar12 = pTVar12 + 1;
    } while (pTVar12 != local_38);
  }
  ParsedIR::LoopLock::~LoopLock(&local_c8);
  return __return_storage_ptr__;
}

Assistant:

ShaderResources Compiler::get_shader_resources(const unordered_set<VariableID> *active_variables) const
{
	ShaderResources res;

	bool ssbo_instance_name = reflection_ssbo_instance_name_is_significant();

	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, const SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);

		// It is possible for uniform storage classes to be passed as function parameters, so detect
		// that. To detect function parameters, check of StorageClass of variable is function scope.
		if (var.storage == StorageClassFunction || !type.pointer)
			return;

		if (active_variables && active_variables->find(var.self) == end(*active_variables))
			return;

		// In SPIR-V 1.4 and up, every global must be present in the entry point interface list,
		// not just IO variables.
		bool active_in_entry_point = true;
		if (ir.get_spirv_version() < 0x10400)
		{
			if (var.storage == StorageClassInput || var.storage == StorageClassOutput)
				active_in_entry_point = interface_variable_exists_in_entry_point(var.self);
		}
		else
			active_in_entry_point = interface_variable_exists_in_entry_point(var.self);

		if (!active_in_entry_point)
			return;

		bool is_builtin = is_builtin_variable(var);

		if (is_builtin)
		{
			if (var.storage != StorageClassInput && var.storage != StorageClassOutput)
				return;

			auto &list = var.storage == StorageClassInput ? res.builtin_inputs : res.builtin_outputs;
			BuiltInResource resource;

			if (has_decoration(type.self, DecorationBlock))
			{
				resource.resource = { var.self, var.basetype, type.self,
				                      get_remapped_declared_block_name(var.self, false) };

				for (uint32_t i = 0; i < uint32_t(type.member_types.size()); i++)
				{
					resource.value_type_id = type.member_types[i];
					resource.builtin = BuiltIn(get_member_decoration(type.self, i, DecorationBuiltIn));
					list.push_back(resource);
				}
			}
			else
			{
				bool strip_array =
						!has_decoration(var.self, DecorationPatch) && (
								get_execution_model() == ExecutionModelTessellationControl ||
								(get_execution_model() == ExecutionModelTessellationEvaluation &&
								 var.storage == StorageClassInput));

				resource.resource = { var.self, var.basetype, type.self, get_name(var.self) };

				if (strip_array && !type.array.empty())
					resource.value_type_id = get_variable_data_type(var).parent_type;
				else
					resource.value_type_id = get_variable_data_type_id(var);

				assert(resource.value_type_id);

				resource.builtin = BuiltIn(get_decoration(var.self, DecorationBuiltIn));
				list.push_back(std::move(resource));
			}
			return;
		}

		// Input
		if (var.storage == StorageClassInput)
		{
			if (has_decoration(type.self, DecorationBlock))
			{
				res.stage_inputs.push_back(
						{ var.self, var.basetype, type.self,
						  get_remapped_declared_block_name(var.self, false) });
			}
			else
				res.stage_inputs.push_back({ var.self, var.basetype, type.self, get_name(var.self) });
		}
		// Subpass inputs
		else if (var.storage == StorageClassUniformConstant && type.image.dim == DimSubpassData)
		{
			res.subpass_inputs.push_back({ var.self, var.basetype, type.self, get_name(var.self) });
		}
		// Outputs
		else if (var.storage == StorageClassOutput)
		{
			if (has_decoration(type.self, DecorationBlock))
			{
				res.stage_outputs.push_back(
						{ var.self, var.basetype, type.self, get_remapped_declared_block_name(var.self, false) });
			}
			else
				res.stage_outputs.push_back({ var.self, var.basetype, type.self, get_name(var.self) });
		}
		// UBOs
		else if (type.storage == StorageClassUniform && has_decoration(type.self, DecorationBlock))
		{
			res.uniform_buffers.push_back(
			    { var.self, var.basetype, type.self, get_remapped_declared_block_name(var.self, false) });
		}
		// Old way to declare SSBOs.
		else if (type.storage == StorageClassUniform && has_decoration(type.self, DecorationBufferBlock))
		{
			res.storage_buffers.push_back(
			    { var.self, var.basetype, type.self, get_remapped_declared_block_name(var.self, ssbo_instance_name) });
		}
		// Modern way to declare SSBOs.
		else if (type.storage == StorageClassStorageBuffer)
		{
			res.storage_buffers.push_back(
			    { var.self, var.basetype, type.self, get_remapped_declared_block_name(var.self, ssbo_instance_name) });
		}
		// Push constant blocks
		else if (type.storage == StorageClassPushConstant)
		{
			// There can only be one push constant block, but keep the vector in case this restriction is lifted
			// in the future.
			res.push_constant_buffers.push_back({ var.self, var.basetype, type.self, get_name(var.self) });
		}
		else if (type.storage == StorageClassShaderRecordBufferKHR)
		{
			res.shader_record_buffers.push_back({ var.self, var.basetype, type.self, get_remapped_declared_block_name(var.self, ssbo_instance_name) });
		}
		// Atomic counters
		else if (type.storage == StorageClassAtomicCounter)
		{
			res.atomic_counters.push_back({ var.self, var.basetype, type.self, get_name(var.self) });
		}
		else if (type.storage == StorageClassUniformConstant)
		{
			if (type.basetype == SPIRType::Image)
			{
				// Images
				if (type.image.sampled == 2)
				{
					res.storage_images.push_back({ var.self, var.basetype, type.self, get_name(var.self) });
				}
				// Separate images
				else if (type.image.sampled == 1)
				{
					res.separate_images.push_back({ var.self, var.basetype, type.self, get_name(var.self) });
				}
			}
			// Separate samplers
			else if (type.basetype == SPIRType::Sampler)
			{
				res.separate_samplers.push_back({ var.self, var.basetype, type.self, get_name(var.self) });
			}
			// Textures
			else if (type.basetype == SPIRType::SampledImage)
			{
				res.sampled_images.push_back({ var.self, var.basetype, type.self, get_name(var.self) });
			}
			// Acceleration structures
			else if (type.basetype == SPIRType::AccelerationStructure)
			{
				res.acceleration_structures.push_back({ var.self, var.basetype, type.self, get_name(var.self) });
			}
			else
			{
				res.gl_plain_uniforms.push_back({ var.self, var.basetype, type.self, get_name(var.self) });
			}
		}
	});

	return res;
}